

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllSyntax.cpp
# Opt level: O0

bool slang::syntax::EventExpressionSyntax::isKind(SyntaxKind kind)

{
  SyntaxKind kind_local;
  bool local_1;
  
  if (((kind == BinaryEventExpression) || (kind == ParenthesizedEventExpression)) ||
     (kind == SignalEventExpression)) {
    local_1 = true;
  }
  else {
    local_1 = false;
  }
  return local_1;
}

Assistant:

bool EventExpressionSyntax::isKind(SyntaxKind kind) {
    switch (kind) {
        case SyntaxKind::BinaryEventExpression:
        case SyntaxKind::ParenthesizedEventExpression:
        case SyntaxKind::SignalEventExpression:
            return true;
        default:
            return false;
    }
}